

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitFunctionDecl(CodegenVisitor *this,FunctionDecl *funcDecl)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  SQFuncState *pSVar4;
  long arg1;
  SQInteger arg3;
  ulong arg2;
  FunctionDecl *in_RSI;
  long in_RDI;
  SQOptimizer *in_stack_00000020;
  SQFuncState *in_stack_00000060;
  SQFunctionProto *funcProto;
  SQOptimizer opt;
  SQFuncState *savedChildFsAtBody;
  SQInteger startLine;
  Block *body;
  SQInteger n;
  ParamDecl *param;
  iterator __end1;
  iterator __begin1;
  ArenaVector<SQCompilation::ParamDecl_*> *__range1;
  SQInteger defparams;
  SQFuncState *savedChildFsAtRoot;
  SQFuncState *in_stack_fffffffffffffec8;
  SQFuncState *in_stack_fffffffffffffed0;
  SQFuncState *in_stack_fffffffffffffed8;
  SQFuncState *in_stack_fffffffffffffee0;
  SQInteger in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  SQObjectPtr *this_00;
  SQObject *in_stack_fffffffffffffef8;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffff00;
  SQFuncState *pSVar5;
  SQInteger in_stack_ffffffffffffff08;
  SQFuncState *in_stack_ffffffffffffff18;
  SQObjectPtr local_d0;
  SQFunctionProto *local_c0;
  undefined1 local_a8 [40];
  undefined8 local_80;
  long local_78;
  Block *local_70;
  long local_68;
  ParamDecl *local_60;
  iterator local_58;
  iterator local_50;
  ArenaVector<SQCompilation::ParamDecl_*> *local_48;
  SQObject local_40;
  long local_30;
  SQObject local_28;
  undefined8 local_18;
  FunctionDecl *local_10;
  
  local_10 = in_RSI;
  addLineNumber((CodegenVisitor *)in_stack_fffffffffffffee0,(Statement *)in_stack_fffffffffffffed8);
  local_18 = *(undefined8 *)(in_RDI + 0x10);
  pSVar4 = SQFuncState::PushChildState
                     (in_stack_fffffffffffffee0,(SQSharedState *)in_stack_fffffffffffffed8);
  *(SQFuncState **)(in_RDI + 0x10) = pSVar4;
  pSVar4 = *(SQFuncState **)(in_RDI + 8);
  FunctionDecl::name(local_10);
  local_28 = SQFuncState::CreateString
                       (in_stack_ffffffffffffff18,(SQChar *)pSVar4,in_stack_ffffffffffffff08);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_fffffffffffffee0,(SQObject *)in_stack_fffffffffffffed8);
  pSVar5 = *(SQFuncState **)(*(long *)(in_RDI + 0x18) + 0x128);
  FunctionDecl::sourceName(local_10);
  SQString::Create((SQSharedState *)in_stack_fffffffffffffee0,(SQChar *)in_stack_fffffffffffffed8,
                   (SQInteger)in_stack_fffffffffffffed0);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_fffffffffffffee0,(SQString *)in_stack_fffffffffffffed8);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_fffffffffffffee0,(SQObjectPtr *)in_stack_fffffffffffffed8);
  bVar1 = FunctionDecl::isVararg(local_10);
  *(bool *)(*(long *)(in_RDI + 0x10) + 0x48) = bVar1;
  local_30 = 0;
  local_40 = SQFuncState::CreateString(pSVar5,(SQChar *)pSVar4,in_stack_ffffffffffffff08);
  SQFuncState::AddParameter(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_48 = FunctionDecl::parameters(local_10);
  local_50 = ArenaVector<SQCompilation::ParamDecl_*>::begin(local_48);
  local_58 = ArenaVector<SQCompilation::ParamDecl_*>::end(local_48);
  for (; local_50 != local_58; local_50 = local_50 + 1) {
    local_60 = *local_50;
    Node::visit<SQCompilation::CodegenVisitor>
              ((Node *)in_stack_fffffffffffffee0,(CodegenVisitor *)in_stack_fffffffffffffed8);
    bVar1 = ParamDecl::hasDefaultValue((ParamDecl *)0x1c61b5);
    if (bVar1) {
      in_stack_ffffffffffffff08 = *(SQInteger *)(in_RDI + 0x10);
      SQFuncState::TopTarget((SQFuncState *)0x1c61d2);
      SQFuncState::AddDefaultParam(in_stack_fffffffffffffed0,(SQInteger)in_stack_fffffffffffffec8);
      local_30 = local_30 + 1;
    }
  }
  for (local_68 = 0; _op = (SQOpcode)((ulong)in_stack_fffffffffffffef8 >> 0x20), local_68 < local_30
      ; local_68 = local_68 + 1) {
    SQFuncState::PopTarget(in_stack_fffffffffffffee0);
  }
  local_70 = FunctionDecl::body(local_10);
  iVar2 = Node::lineStart((Node *)local_70);
  local_78 = (long)iVar2;
  if (local_78 != -1) {
    SQFuncState::AddLineInfos
              (in_stack_fffffffffffffee0,(SQInteger)in_stack_fffffffffffffed8,
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x30,0));
  }
  local_80 = *(undefined8 *)(in_RDI + 0x10);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x10);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  FunctionDecl::body(local_10);
  Node::visit<SQCompilation::CodegenVisitor>
            ((Node *)in_stack_fffffffffffffee0,(CodegenVisitor *)in_stack_fffffffffffffed8);
  *(undefined8 *)(in_RDI + 0x10) = local_80;
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x158);
  pSVar5 = *(SQFuncState **)(in_RDI + 0x10);
  Node::lineEnd((Node *)local_70);
  SQFuncState::AddLineInfos
            (in_stack_fffffffffffffee0,(SQInteger)in_stack_fffffffffffffed8,
             SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffed0 >> 0x30,0));
  SQFuncState::AddInstruction
            (pSVar5,_op,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (SQInteger)in_stack_fffffffffffffee0,(SQInteger)in_stack_fffffffffffffed8);
  if ((**(ulong **)(in_RDI + 0x10) & 0x200) == 0) {
    _op = (SQOpcode)((ulong)local_a8 >> 0x20);
    SQOptimizer::SQOptimizer((SQOptimizer *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    SQOptimizer::optimize(in_stack_00000020);
    SQOptimizer::~SQOptimizer((SQOptimizer *)0x1c63aa);
  }
  SQFuncState::SetStackSize(pSVar4,in_stack_ffffffffffffff08);
  iVar2 = FunctionDecl::hoistingLevel(local_10);
  *(long *)(*(long *)(in_RDI + 0x10) + 0x1d8) = (long)iVar2;
  local_c0 = SQFuncState::BuildProto(in_stack_00000060);
  arg1 = *(long *)(in_RDI + 8) + 0x80;
  this_00 = &local_d0;
  ::SQObjectPtr::SQObjectPtr(this_00,local_c0);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_fffffffffffffee0,
             (SQObjectPtr *)in_stack_fffffffffffffed8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffed0);
  SQFuncState::PopChildState(in_stack_fffffffffffffee0);
  *(undefined8 *)(in_RDI + 0x10) = local_18;
  arg3 = SQFuncState::PushTarget(in_stack_fffffffffffffed8,*(SQInteger *)(in_RDI + 8));
  sVar3 = sqvector<SQObjectPtr,_unsigned_int>::size
                    ((sqvector<SQObjectPtr,_unsigned_int> *)(*(long *)(in_RDI + 8) + 0x80));
  arg2 = (ulong)(sVar3 - 1);
  FunctionDecl::isLambda(local_10);
  SQFuncState::AddInstruction(pSVar5,_op,(SQInteger)this_00,arg1,arg2,arg3);
  return;
}

Assistant:

void CodegenVisitor::visitFunctionDecl(FunctionDecl *funcDecl) {
    addLineNumber(funcDecl);

    SQFuncState *savedChildFsAtRoot = _childFs; // may be non-null when processing default argument that is declared as function/lambda
    _childFs = _fs->PushChildState(_ss(_vm));

    _childFs->_name = _fs->CreateString(funcDecl->name());
    _childFs->_sourcename = _fs->_sourcename = SQString::Create(_ss(_vm), funcDecl->sourceName());
    _childFs->_varparams = funcDecl->isVararg();

    SQInteger defparams = 0;

    _childFs->AddParameter(_fs->CreateString("this"));

    for (auto param : funcDecl->parameters()) {
        param->visit(this);
        if (param->hasDefaultValue()) {
            _childFs->AddDefaultParam(_fs->TopTarget());
            ++defparams;
        }
    }

    for (SQInteger n = 0; n < defparams; n++) {
        _fs->PopTarget();
    }

    Block *body = funcDecl->body();
    SQInteger startLine = body->lineStart();
    if (startLine != -1) {
        _childFs->AddLineInfos(startLine, _lineinfo, false);
    }

    {
        assert(_childFs->_parent == _fs);
        SQFuncState *savedChildFsAtBody = _childFs;
        _fs = _childFs;
        _childFs = NULL;

        funcDecl->body()->visit(this);

        _childFs = savedChildFsAtBody;
        _fs = _childFs->_parent;
    }

    _childFs->AddLineInfos(body->lineEnd(), _lineinfo, true);
    _childFs->AddInstruction(_OP_RETURN, -1);

    if (!(_childFs->lang_features & LF_DISABLE_OPTIMIZER)) {
        SQOptimizer opt(*_childFs);
        opt.optimize();
    }

    _childFs->SetStackSize(0);
    _childFs->_hoistLevel = funcDecl->hoistingLevel();
    SQFunctionProto *funcProto = _childFs->BuildProto();

    _fs->_functions.push_back(funcProto);

    _fs->PopChildState();
    _childFs = savedChildFsAtRoot;

    _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, funcDecl->isLambda() ? 1 : 0);
}